

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O2

void permute(size_t *arr,size_t n)

{
  size_t sVar1;
  uint32_t uVar2;
  
  for (; n != 1; n = n - 1) {
    uVar2 = secp256k1_testrand_int((uint32_t)n);
    sVar1 = arr[n - 1];
    arr[n - 1] = arr[uVar2];
    arr[uVar2] = sVar1;
  }
  return;
}

Assistant:

static void permute(size_t *arr, size_t n) {
    size_t i;
    for (i = n - 1; i >= 1; i--) {
        size_t tmp, j;
        j = secp256k1_testrand_int(i + 1);
        tmp = arr[i];
        arr[i] = arr[j];
        arr[j] = tmp;
    }
}